

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptorProto::SerializeWithCachedSizes
          (MethodDescriptorProto *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  string *psVar4;
  MethodOptions *value;
  UnknownFieldSet *pUVar5;
  CodedOutputStream *output_local;
  MethodDescriptorProto *this_local;
  
  bVar1 = has_name(this);
  if (bVar1) {
    name_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar3,iVar2,SERIALIZE);
    psVar4 = name_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(1,psVar4,output);
  }
  bVar1 = has_input_type(this);
  if (bVar1) {
    input_type_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    input_type_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar3,iVar2,SERIALIZE);
    psVar4 = input_type_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(2,psVar4,output);
  }
  bVar1 = has_output_type(this);
  if (bVar1) {
    output_type_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    output_type_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar3,iVar2,SERIALIZE);
    psVar4 = output_type_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(3,psVar4,output);
  }
  bVar1 = has_options(this);
  if (bVar1) {
    value = options(this);
    internal::WireFormatLite::WriteMessageMaybeToArray(4,(MessageLite *)value,output);
  }
  pUVar5 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar5);
  if (!bVar1) {
    pUVar5 = unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(pUVar5,output);
  }
  return;
}

Assistant:

void MethodDescriptorProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->name(), output);
  }

  // optional string input_type = 2;
  if (has_input_type()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->input_type().data(), this->input_type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      2, this->input_type(), output);
  }

  // optional string output_type = 3;
  if (has_output_type()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->output_type().data(), this->output_type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      3, this->output_type(), output);
  }

  // optional .google.protobuf.MethodOptions options = 4;
  if (has_options()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      4, this->options(), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}